

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this,ON_BrepLoop *L)

{
  int iVar1;
  ON_BrepLoop *pOVar2;
  bool local_3a;
  bool local_39;
  ON_BrepLoop *local_30;
  ON_BrepLoop *newloop;
  int lti1;
  int lti0;
  int li;
  bool rval;
  bool rc;
  ON_BrepLoop *L_local;
  ON_Brep *this_local;
  
  lti0._3_1_ = 0;
  lti0._2_1_ = 1;
  lti1 = L->m_loop_index;
  _li = L;
  L_local = (ON_BrepLoop *)this;
  while( true ) {
    local_39 = false;
    if ((lti0._2_1_ & 1) != 0) {
      pOVar2 = Loop(this,lti1);
      local_39 = FoundSlitPair(pOVar2,(int *)((long)&newloop + 4),(int *)&newloop);
    }
    if (local_39 == false) break;
    local_30 = (ON_BrepLoop *)0x0;
    lti0._2_1_ = RemoveSlitPair(this,lti1,newloop._4_4_,(int)newloop,&local_30);
    local_3a = true;
    if ((lti0._3_1_ & 1) == 0) {
      local_3a = (bool)lti0._2_1_;
    }
    lti0._3_1_ = local_3a;
    if (((bool)lti0._2_1_) && (local_30 != (ON_BrepLoop *)0x0)) {
      RemoveSlits(this,local_30);
    }
  }
  pOVar2 = Loop(this,lti1);
  if (pOVar2 != (ON_BrepLoop *)0x0) {
    pOVar2 = Loop(this,lti1);
    iVar1 = ON_SimpleArray<int>::Count(&pOVar2->m_ti);
    if (iVar1 == 0) {
      pOVar2 = Loop(this,lti1);
      DeleteLoop(this,pOVar2,true);
    }
  }
  return (bool)(lti0._3_1_ & 1);
}

Assistant:

bool ON_Brep::RemoveSlits(ON_BrepLoop& L)

{
  bool rc = false;
  bool rval = true;
  const int li = L.m_loop_index;

  int lti0, lti1;
  while (rval && FoundSlitPair(*Loop(li), &lti0, &lti1)){ 
    ON_BrepLoop* newloop = nullptr;
		// Warning- This can add a loop and or face causing
		//  reallocation of arrays so refernces (like L) are
		//  no longer valid.
    rval = RemoveSlitPair(*this, li, lti0, lti1, newloop);
    rc = rc || rval;
    if(rval && newloop)
      RemoveSlits(*newloop);
  }

	// 22-Oct-2009 Crash Fix TRR#55897
  if (Loop(li) && Loop(li)->m_ti.Count() == 0) 
    DeleteLoop(*Loop(li), true);
  
  return rc;
}